

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::PrimitiveRestartTest::createBufferData
          (PrimitiveRestartTest *this,VkPrimitiveTopology topology,int primitiveCount,
          VkIndexType indexType,vector<unsigned_int,_std::allocator<unsigned_int>_> *indexData,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexData)

{
  undefined8 extraout_RAX;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var1;
  uint *extraout_RAX_00;
  int iVar2;
  uint uVar3;
  int vertexNdx_1;
  float fVar4;
  float fVar5;
  bool bVar6;
  int vertexNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Vertex4RGBA vertex;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  Vertex4RGBA defaultVertex;
  uint local_dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  value_type local_a8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_88;
  float local_68;
  float local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *local_58;
  value_type local_50;
  
  local_50.position.m_data[0] = -1.0;
  local_50.position.m_data[1] = -1.0;
  local_50.position.m_data[2] = 0.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = 0.0;
  local_50.color.m_data[1] = 1.0;
  local_50.color.m_data[2] = 0.0;
  local_50.color.m_data[3] = 1.0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    iVar2 = primitiveCount / 2;
    break;
  default:
    local_b0 = 1.6;
    local_b4 = 0.0;
    goto LAB_00500825;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    iVar2 = primitiveCount - primitiveCount / 2;
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    local_b4 = 0.8;
    local_b0 = 0.8;
    goto LAB_00500825;
  }
  local_b0 = 1.6;
  local_b4 = 1.6 / (float)iVar2;
LAB_00500825:
  local_b8 = (float)primitiveCount;
  local_60 = indexData;
  local_58 = vertexData;
  switch(topology - VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
  case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
    if (0 < primitiveCount) {
      fVar4 = 0.0;
      bVar6 = true;
      do {
        local_a8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a8);
        if (_Var1._M_current ==
            (this->m_restartPrimitives).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (bVar6) {
            local_a8.position.m_data[1] = (float)((uint)fVar4 & 1) * local_b0 + -0.8;
            local_a8.position.m_data[0] = (float)((uint)fVar4 >> 1) * local_b4 + -0.8;
            local_a8.position.m_data[2] = 0.0;
            local_a8.position.m_data[3] = 1.0;
            local_a8.color.m_data[0] = 1.0;
            local_a8.color.m_data[1] = 0.0;
            local_a8.color.m_data[2] = 0.0;
            local_a8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_88,&local_a8);
            local_dc = (int)((ulong)((long)local_88.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_dc);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_dc;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar6 = false;
          }
          local_a8.position.m_data[1] = (float)((int)fVar4 + 1U & 1) * local_b0 + -0.8;
          local_a8.position.m_data[0] = (float)((int)fVar4 + 1U >> 1) * local_b4 + -0.8;
          local_a8.position.m_data[2] = 0.0;
          local_a8.position.m_data[3] = 1.0;
          local_a8.color.m_data[0] = 1.0;
          local_a8.color.m_data[1] = 0.0;
          local_a8.color.m_data[2] = 0.0;
          local_a8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_88,&local_a8);
          local_dc = (int)((ulong)((long)local_88.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_dc;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_a8.position.m_data._0_8_ =
               CONCAT44(local_a8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          bVar6 = true;
        }
        fVar4 = (float)((int)fVar4 + 1);
      } while (local_b8 != fVar4);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
    if (0 < primitiveCount) {
      fVar4 = 0.0;
      local_ac = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
      bVar6 = true;
      do {
        local_a8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a8);
        if (_Var1._M_current ==
            (this->m_restartPrimitives).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (bVar6) {
            iVar2 = 0;
            do {
              local_a8.position.m_data[1] = (float)(iVar2 + (int)fVar4 & 1) * local_b0 + -0.8;
              local_a8.position.m_data[0] =
                   (float)((uint)(iVar2 + (int)fVar4) >> 1) * local_b4 + -0.8;
              local_a8.position.m_data[2] = 0.0;
              local_a8.position.m_data[3] = 1.0;
              local_a8.color.m_data[0] = 1.0;
              local_a8.color.m_data[1] = 0.0;
              local_a8.color.m_data[2] = 0.0;
              local_a8.color.m_data[3] = 1.0;
              std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
              push_back(&local_88,&local_a8);
              local_dc = (int)((ulong)((long)local_88.
                                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_88.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_dc);
              }
              else {
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_dc;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 == 1);
            bVar6 = false;
          }
          uVar3 = ((int)fVar4 - ((int)((int)fVar4 + 2U) >> 0x1f)) + 2;
          local_a8.position.m_data[1] =
               (float)(int)(((int)fVar4 + 2U) - (uVar3 & 0xfffffffe)) * local_b0 + -0.8;
          local_a8.position.m_data[0] = (float)((int)uVar3 >> 1) * local_b4 + -0.8;
          local_a8.position.m_data[2] = 0.0;
          local_a8.position.m_data[3] = 1.0;
          local_a8.color.m_data[0] = 1.0;
          local_a8.color.m_data[1] = 0.0;
          local_a8.color.m_data[2] = 0.0;
          local_a8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_88,&local_a8);
          local_dc = (int)((ulong)((long)local_88.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_dc;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_a8.position.m_data[0] = local_ac;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)local_ac;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          bVar6 = true;
        }
        fVar4 = (float)((int)fVar4 + 1);
      } while (fVar4 != local_b8);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    if (0 < primitiveCount) {
      local_64 = 1.5707964;
      if (6.2831855 / (float)primitiveCount <= 1.5707964) {
        local_64 = 6.2831855 / (float)primitiveCount;
      }
      fVar4 = 0.0;
      bVar6 = true;
      do {
        local_a8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a8);
        if (_Var1._M_current ==
            (this->m_restartPrimitives).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (bVar6) {
            local_a8.position.m_data[0] = 0.0;
            local_a8.position.m_data[1] = 0.0;
            local_a8.position.m_data[2] = 0.0;
            local_a8.position.m_data[3] = 1.0;
            local_a8.color.m_data[0] = 1.0;
            local_a8.color.m_data[1] = 0.0;
            local_a8.color.m_data[2] = 0.0;
            local_a8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_88,&local_a8);
            local_dc = (int)((ulong)((long)local_88.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_dc);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_dc;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_68 = (float)(int)fVar4 * local_64;
            local_ac = cosf(local_68);
            local_a8.position.m_data[1] = sinf(local_68);
            local_a8.position.m_data[0] = local_ac * local_b4;
            local_a8.position.m_data[1] = local_a8.position.m_data[1] * local_b0;
            local_a8.position.m_data[2] = 0.0;
            local_a8.position.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_88,&local_a8);
            local_dc = (int)((ulong)((long)local_88.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_dc);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_dc;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar6 = false;
          }
          local_68 = (float)(int)((int)fVar4 + 1) * local_64;
          local_ac = cosf(local_68);
          fVar5 = sinf(local_68);
          local_a8.position.m_data[1] = fVar5 * local_b0;
          local_a8.position.m_data[0] = local_ac * local_b4;
          local_a8.position.m_data[2] = 0.0;
          local_a8.position.m_data[3] = 1.0;
          local_a8.color.m_data[0] = 1.0;
          local_a8.color.m_data[1] = 0.0;
          local_a8.color.m_data[2] = 0.0;
          local_a8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_88,&local_a8);
          local_dc = (int)((ulong)((long)local_88.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_dc;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_a8.position.m_data._0_8_ =
               CONCAT44(local_a8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          bVar6 = true;
        }
        fVar4 = (float)((int)fVar4 + 1);
      } while (local_b8 != fVar4);
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_88,&local_50);
    if (0 < (int)local_b8) {
      fVar4 = 0.0;
      bVar6 = true;
      do {
        local_a8.position.m_data[0] = fVar4;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a8);
        if (_Var1._M_current ==
            (this->m_restartPrimitives).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (bVar6) {
            local_a8.position.m_data._0_8_ = (ulong)(uint)local_a8.position.m_data[1] << 0x20;
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_a8.position.m_data[1] = (float)((uint)fVar4 & 1) * local_b0 + -0.8;
            local_a8.position.m_data[0] = (float)((uint)fVar4 >> 1) * local_b4 + -0.8;
            local_a8.position.m_data[2] = 0.0;
            local_a8.position.m_data[3] = 1.0;
            local_a8.color.m_data[0] = 1.0;
            local_a8.color.m_data[1] = 0.0;
            local_a8.color.m_data[2] = 0.0;
            local_a8.color.m_data[3] = 1.0;
            std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
            push_back(&local_88,&local_a8);
            local_dc = (int)((ulong)((long)local_88.
                                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_dc);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_dc;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar6 = false;
          }
          local_a8.position.m_data[1] = (float)((int)fVar4 + 1U & 1) * local_b0 + -0.8;
          local_a8.position.m_data[0] = (float)((int)fVar4 + 1U >> 1) * local_b4 + -0.8;
          local_a8.position.m_data[2] = 0.0;
          local_a8.position.m_data[3] = 1.0;
          local_a8.color.m_data[0] = 1.0;
          local_a8.color.m_data[1] = 0.0;
          local_a8.color.m_data[2] = 0.0;
          local_a8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_88,&local_a8);
          local_dc = (int)((ulong)((long)local_88.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_dc;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_a8.position.m_data._0_8_ = (ulong)(uint)local_a8.position.m_data[1] << 0x20;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_a8.position.m_data._0_8_ =
               CONCAT44(local_a8.position.m_data[1],-(uint)(indexType != VK_INDEX_TYPE_UINT16)) |
               0xffff;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = -(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff
            ;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          bVar6 = true;
        }
        fVar4 = (float)((int)fVar4 + 1);
      } while (local_b8 != fVar4);
    }
    local_a8.position.m_data._0_8_ = (ulong)(uint)local_a8.position.m_data[1] << 0x20;
    if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_a8);
    }
    else {
      *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    break;
  case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (&local_88,&local_50);
    if (0 < (int)local_b8) {
      fVar5 = 0.0;
      fVar4 = (float)(-(uint)(indexType != VK_INDEX_TYPE_UINT16) | 0xffff);
      local_ac = (float)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      local_68 = fVar4;
      do {
        local_a8.position.m_data[0] = fVar5;
        _Var1 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->m_restartPrimitives).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a8);
        if (_Var1._M_current ==
            (this->m_restartPrimitives).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (((uint)local_ac & 1) != 0) {
            iVar2 = 0;
            do {
              local_a8.position.m_data[1] = (float)(iVar2 + (int)fVar5 & 1) * local_b0 + -0.8;
              local_a8.position.m_data[0] =
                   (float)((uint)(iVar2 + (int)fVar5) >> 1) * local_b4 + -0.8;
              local_a8.position.m_data[2] = 0.0;
              local_a8.position.m_data[3] = 1.0;
              local_a8.color.m_data[0] = 1.0;
              local_a8.color.m_data[1] = 0.0;
              local_a8.color.m_data[2] = 0.0;
              local_a8.color.m_data[3] = 1.0;
              std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
              push_back(&local_88,&local_a8);
              local_dc = (int)((ulong)((long)local_88.
                                             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_88.
                                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_dc);
              }
              else {
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_dc;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_dc = 0;
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_dc);
              }
              else {
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 == 1);
            local_ac = 0.0;
            fVar4 = local_68;
          }
          uVar3 = ((int)fVar5 - ((int)((int)fVar5 + 2U) >> 0x1f)) + 2;
          local_a8.position.m_data[1] =
               (float)(int)(((int)fVar5 + 2U) - (uVar3 & 0xfffffffe)) * local_b0 + -0.8;
          local_a8.position.m_data[0] = (float)((int)uVar3 >> 1) * local_b4 + -0.8;
          local_a8.position.m_data[2] = 0.0;
          local_a8.position.m_data[3] = 1.0;
          local_a8.color.m_data[0] = 1.0;
          local_a8.color.m_data[1] = 0.0;
          local_a8.color.m_data[2] = 0.0;
          local_a8.color.m_data[3] = 1.0;
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back(&local_88,&local_a8);
          local_dc = (int)((ulong)((long)local_88.
                                         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_88.
                                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_dc;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_dc = 0;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_dc);
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_a8.position.m_data[0] = fVar4;
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_a8);
            _Var1._M_current = extraout_RAX_00;
          }
          else {
            *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)fVar4;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_ac = (float)CONCAT71((int7)((ulong)_Var1._M_current >> 8),1);
        }
        fVar5 = (float)((int)fVar5 + 1);
      } while (fVar5 != local_b8);
    }
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (local_58,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_60,&local_d8);
  if (local_88.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrimitiveRestartTest::createBufferData (VkPrimitiveTopology topology, int primitiveCount, VkIndexType indexType, std::vector<deUint32>& indexData, std::vector<Vertex4RGBA>& vertexData) const
{
	DE_ASSERT(primitiveCount > 0);
	DE_UNREF(indexType);

	const tcu::Vec4				red						(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4				green					(0.0f, 1.0f, 0.0f, 1.0f);
	const float					border					= 0.2f;
	const float					originX					= -1.0f + border;
	const float					originY					= -1.0f + border;
	const Vertex4RGBA			defaultVertex			= { tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), green };
	float						primitiveSizeY			= (2.0f - 2.0f * border);
	float						primitiveSizeX;
	bool						primitiveStart			= true;
	std::vector<deUint32>		indices;
	std::vector<Vertex4RGBA>	vertices;


	// Calculate primitive size
	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			primitiveSizeX = (2.0f - 2.0f * border) / float(primitiveCount / 2 + primitiveCount % 2);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
			primitiveSizeX = 1.0f - border;
			primitiveSizeY = 1.0f - border;
			break;

		default:
			primitiveSizeX = 0.0f; // Garbage
			DE_ASSERT(false);
	}

	switch (topology)
	{
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		{
			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
						}

						primitiveStart = false;
					}
					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		{
			const float stepAngle = de::min(DE_PI * 0.5f, (2 * DE_PI) / float(primitiveCount));

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						Vertex4RGBA vertex =
						{
							tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						vertex.position = tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx)), 0.0f, 1.0f),
						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(primitiveSizeX * deFloatCos(stepAngle * float(primitiveNdx + 1)), primitiveSizeY * deFloatSin(stepAngle * float(primitiveNdx + 1)), 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}
			break;
		}

		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(0);
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						indices.push_back(0);

						const Vertex4RGBA vertex =
						{
							tcu::Vec4(originX + float(primitiveNdx / 2) * primitiveSizeX, originY + float(primitiveNdx % 2) * primitiveSizeY, 0.0f, 1.0f),
							red
						};

						vertices.push_back(vertex);
						indices.push_back((deUint32)vertices.size() - 1);

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 1) / 2) * primitiveSizeX, originY + float((primitiveNdx + 1) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
				}
			}

			indices.push_back(0);
			break;

		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vertices.push_back(defaultVertex);

			for (int primitiveNdx = 0; primitiveNdx < primitiveCount; primitiveNdx++)
			{
				if (isRestartPrimitive(primitiveNdx))
				{
					indices.push_back(InputAssemblyTest::getRestartIndex(indexType));
					primitiveStart = true;
				}
				else
				{
					if (primitiveStart)
					{
						for (int vertexNdx = 0; vertexNdx < 2; vertexNdx++)
						{
							const Vertex4RGBA vertex =
							{
								tcu::Vec4(originX + float((primitiveNdx + vertexNdx) / 2) * primitiveSizeX, originY + float((primitiveNdx + vertexNdx) % 2) * primitiveSizeY, 0.0f, 1.0f),
								red
							};

							vertices.push_back(vertex);
							indices.push_back((deUint32)vertices.size() - 1);
							indices.push_back(0);
						}

						primitiveStart = false;
					}

					const Vertex4RGBA vertex =
					{
						tcu::Vec4(originX + float((primitiveNdx + 2) / 2) * primitiveSizeX, originY + float((primitiveNdx + 2) % 2) * primitiveSizeY, 0.0f, 1.0f),
						red
					};

					vertices.push_back(vertex);
					indices.push_back((deUint32)vertices.size() - 1);
					indices.push_back(0);
				}
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	vertexData	= vertices;
	indexData	= indices;
}